

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::link(QFile *this,char *__from,char *__to)

{
  QFileDevicePrivate *this_00;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QFileInfo fi;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])
            ((QArrayDataPointer<char16_t> *)&local_58,this);
  lVar1 = CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (lVar1 == 0) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context._4_8_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.category = "default";
    iVar2 = 0;
    QMessageLogger::warning(&local_58,"QFile::link: Empty or null file name");
  }
  else {
    fi.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&fi,(QString *)__from);
    iVar2 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    QFileInfo::absoluteFilePath((QString *)&local_58,&fi);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x70))
                      ((long *)CONCAT44(extraout_var,iVar2),&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    if ((char)iVar2 == '\0') {
      QAbstractFileEngine::errorString
                ((QString *)&local_58,
                 (QAbstractFileEngine *)
                 (this_00->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
      QFileDevicePrivate::setError(this_00,RenameError,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      QFileDevice::unsetError(&this->super_QFileDevice);
    }
    QFileInfo::~QFileInfo(&fi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::link(const QString &linkName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::link: Empty or null file name");
        return false;
    }
    QFileInfo fi(linkName);
    if (d->engine()->link(fi.absoluteFilePath())) {
        unsetError();
        return true;
    }
    d->setError(QFile::RenameError, d->fileEngine->errorString());
    return false;
}